

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTiledRgba.cpp
# Opt level: O0

void anon_unknown.dwarf_1fd494::writeReadRGBARIP
               (char *fileName,int width,int height,RgbaChannels channels,Compression comp,int xSize
               ,int ySize)

{
  int iVar1;
  bool bVar2;
  int h;
  int iVar3;
  LineOrder LVar4;
  Compression CVar5;
  RgbaChannels RVar6;
  int iVar7;
  ostream *poVar8;
  void *pvVar9;
  LineOrder *pLVar10;
  Compression *pCVar11;
  Rgba *pRVar12;
  Array2D<Imf_2_5::Rgba> *pAVar13;
  float *pfVar14;
  V2f *v;
  RgbaChannels in_ECX;
  char *in_RDI;
  Compression in_R8D;
  int in_R9D;
  float fVar15;
  float fVar16;
  int in_stack_00000008;
  int x;
  int y;
  int lx;
  int ly;
  int levelHeight_1;
  int levelWidth_1;
  int xlevel_1;
  int ylevel_1;
  Array2D<Imf_2_5::Array2D<Imf_2_5::Rgba>_> levels2;
  int numYLevels;
  int numXLevels;
  int dwy;
  int dwx;
  Box2i *dw;
  TiledRgbaInputFile in;
  int levelHeight;
  int levelWidth;
  int xlevel;
  int ylevel;
  TiledRgbaOutputFile out;
  Array2D<Imf_2_5::Array2D<Imf_2_5::Rgba>_> levels;
  Header header;
  int in_stack_fffffffffffffc9c;
  undefined4 uVar17;
  undefined4 in_stack_fffffffffffffca4;
  int in_stack_fffffffffffffcac;
  TiledRgbaInputFile *in_stack_fffffffffffffcb0;
  undefined4 in_stack_fffffffffffffcc0;
  float in_stack_fffffffffffffcc4;
  undefined8 in_stack_fffffffffffffcc8;
  undefined8 in_stack_fffffffffffffcd0;
  undefined8 in_stack_fffffffffffffcd8;
  LineOrder in_stack_fffffffffffffce0;
  float in_stack_fffffffffffffce4;
  V2f *in_stack_fffffffffffffce8;
  TiledRgbaInputFile *in_stack_fffffffffffffcf0;
  long in_stack_fffffffffffffcf8;
  undefined4 in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd04;
  undefined8 in_stack_fffffffffffffd10;
  undefined8 in_stack_fffffffffffffd18;
  undefined4 in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd24;
  char *in_stack_fffffffffffffd28;
  Array2D<Imf_2_5::Array2D<Imf_2_5::Rgba>_> *in_stack_fffffffffffffd30;
  LevelMode in_stack_fffffffffffffd40;
  LevelRoundingMode in_stack_fffffffffffffd48;
  int in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffdfc;
  size_t in_stack_fffffffffffffe00;
  Rgba *in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  int iVar18;
  int iVar19;
  undefined4 in_stack_fffffffffffffe90;
  int local_140;
  int local_13c;
  int local_138;
  int local_134;
  Vec2<float> local_130;
  int local_128;
  int local_124;
  int local_120;
  int local_11c;
  Array2D<Imf_2_5::Array2D<Imf_2_5::Rgba>_> local_118;
  int local_100;
  int local_fc;
  int local_f8;
  int local_f4;
  Box2i *local_f0;
  int local_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  Array2D<Imf_2_5::Array2D<Imf_2_5::Rgba>_> local_88;
  Vec2<float> local_60 [8];
  int local_1c;
  Compression local_18;
  RgbaChannels local_14;
  char *local_8;
  
  iVar7 = (int)((ulong)in_stack_fffffffffffffd10 >> 0x20);
  local_1c = in_R9D;
  local_18 = in_R8D;
  local_14 = in_ECX;
  local_8 = in_RDI;
  poVar8 = std::operator<<((ostream *)&std::cout,"levelMode 2");
  poVar8 = std::operator<<(poVar8,", compression ");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_18);
  poVar8 = std::operator<<(poVar8,", tileSize ");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_1c);
  poVar8 = std::operator<<(poVar8,"x");
  pvVar9 = (void *)std::ostream::operator<<(poVar8,in_stack_00000008);
  std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
  Imath_2_5::Vec2<float>::Vec2(local_60,0.0,0.0);
  Imf_2_5::Header::Header
            ((Header *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
             (int)((ulong)in_stack_fffffffffffffcf8 >> 0x20),(int)in_stack_fffffffffffffcf8,
             (float)((ulong)in_stack_fffffffffffffcf0 >> 0x20),in_stack_fffffffffffffce8,
             in_stack_fffffffffffffce4,in_stack_fffffffffffffce0,
             (Compression)((ulong)in_stack_fffffffffffffcd8 >> 0x20));
  pLVar10 = Imf_2_5::Header::lineOrder((Header *)0x21a18a);
  *pLVar10 = INCREASING_Y;
  pCVar11 = Imf_2_5::Header::compression((Header *)0x21a1bd);
  *pCVar11 = local_18;
  Imf_2_5::Array2D<Imf_2_5::Array2D<Imf_2_5::Rgba>_>::Array2D(&local_88);
  pRVar12 = (Rgba *)std::operator<<((ostream *)&std::cout," writing");
  std::ostream::operator<<(pRVar12,std::flush<char,std::char_traits<char>>);
  remove(local_8);
  RVar6 = local_14;
  h = Imf_2_5::globalThreadCount();
  uVar17 = 1;
  iVar19 = h;
  Imf_2_5::TiledRgbaOutputFile::TiledRgbaOutputFile
            ((TiledRgbaOutputFile *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
             (Header *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
             (RgbaChannels)((ulong)in_stack_fffffffffffffd18 >> 0x20),(int)in_stack_fffffffffffffd18
             ,iVar7,in_stack_fffffffffffffd40,in_stack_fffffffffffffd48,in_stack_fffffffffffffd50);
  Imf_2_5::TiledRgbaOutputFile::numYLevels((TiledRgbaOutputFile *)0x21a2cc);
  Imf_2_5::TiledRgbaOutputFile::numXLevels((TiledRgbaOutputFile *)0x21a2f3);
  Imf_2_5::Array2D<Imf_2_5::Array2D<Imf_2_5::Rgba>_>::resizeErase
            (in_stack_fffffffffffffd30,(long)in_stack_fffffffffffffd28,
             CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20));
  iVar7 = local_1c;
  iVar18 = in_stack_00000008;
  CVar5 = local_18;
  for (local_a4 = 0; iVar1 = local_a4,
      iVar3 = Imf_2_5::TiledRgbaOutputFile::numYLevels((TiledRgbaOutputFile *)0x21a343),
      iVar1 < iVar3; local_a4 = local_a4 + 1) {
    for (local_a8 = 0; iVar1 = local_a8,
        iVar3 = Imf_2_5::TiledRgbaOutputFile::numXLevels((TiledRgbaOutputFile *)0x21a388),
        iVar1 < iVar3; local_a8 = local_a8 + 1) {
      local_ac = Imf_2_5::TiledRgbaOutputFile::levelWidth
                           ((TiledRgbaOutputFile *)CONCAT44(in_stack_fffffffffffffca4,uVar17),
                            in_stack_fffffffffffffc9c);
      local_b0 = Imf_2_5::TiledRgbaOutputFile::levelHeight
                           ((TiledRgbaOutputFile *)CONCAT44(in_stack_fffffffffffffca4,uVar17),
                            in_stack_fffffffffffffc9c);
      Imf_2_5::Array2D<Imf_2_5::Array2D<Imf_2_5::Rgba>_>::operator[](&local_88,(long)local_a4);
      Imf_2_5::Array2D<Imf_2_5::Rgba>::resizeErase
                ((Array2D<Imf_2_5::Rgba> *)
                 CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                 in_stack_fffffffffffffcf8,(long)in_stack_fffffffffffffcf0);
      Imf_2_5::Array2D<Imf_2_5::Array2D<Imf_2_5::Rgba>_>::operator[](&local_88,(long)local_a4);
      fillPixels((Array2D<Imf_2_5::Rgba> *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac,h);
      pAVar13 = Imf_2_5::Array2D<Imf_2_5::Array2D<Imf_2_5::Rgba>_>::operator[]
                          (&local_88,(long)local_a4);
      Imf_2_5::Array2D<Imf_2_5::Rgba>::operator[](pAVar13 + local_a8,0);
      Imf_2_5::TiledRgbaOutputFile::setFrameBuffer
                ((TiledRgbaOutputFile *)
                 CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                 in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
                 CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
      Imf_2_5::TiledRgbaOutputFile::numXTiles
                ((TiledRgbaOutputFile *)CONCAT44(in_stack_fffffffffffffca4,uVar17),
                 in_stack_fffffffffffffc9c);
      Imf_2_5::TiledRgbaOutputFile::numYTiles
                ((TiledRgbaOutputFile *)CONCAT44(in_stack_fffffffffffffca4,uVar17),
                 in_stack_fffffffffffffc9c);
      Imf_2_5::TiledRgbaOutputFile::writeTiles
                ((TiledRgbaOutputFile *)
                 CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                 (int)((ulong)in_stack_fffffffffffffcd8 >> 0x20),(int)in_stack_fffffffffffffcd8,
                 (int)((ulong)in_stack_fffffffffffffcd0 >> 0x20),(int)in_stack_fffffffffffffcd0,
                 (int)((ulong)in_stack_fffffffffffffcc8 >> 0x20),(int)in_stack_fffffffffffffcf0);
    }
  }
  Imf_2_5::TiledRgbaOutputFile::~TiledRgbaOutputFile
            ((TiledRgbaOutputFile *)in_stack_fffffffffffffcb0);
  poVar8 = std::operator<<((ostream *)&std::cout," reading");
  std::ostream::operator<<(poVar8,std::flush<char,std::char_traits<char>>);
  Imf_2_5::globalThreadCount();
  Imf_2_5::TiledRgbaInputFile::TiledRgbaInputFile
            (in_stack_fffffffffffffcf0,(char *)in_stack_fffffffffffffce8,
             (int)in_stack_fffffffffffffce4);
  local_f0 = Imf_2_5::TiledRgbaInputFile::dataWindow((TiledRgbaInputFile *)0x21a68a);
  local_f4 = (local_f0->min).x;
  local_f8 = (local_f0->min).y;
  local_fc = Imf_2_5::TiledRgbaInputFile::numXLevels((TiledRgbaInputFile *)0x21a6d4);
  local_100 = Imf_2_5::TiledRgbaInputFile::numYLevels((TiledRgbaInputFile *)0x21a6f8);
  Imf_2_5::Array2D<Imf_2_5::Array2D<Imf_2_5::Rgba>_>::Array2D
            ((Array2D<Imf_2_5::Array2D<Imf_2_5::Rgba>_> *)
             CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),in_stack_fffffffffffffcf8
             ,(long)in_stack_fffffffffffffcf0);
  for (local_11c = 0; local_11c < local_100; local_11c = local_11c + 1) {
    for (local_120 = 0; local_120 < local_fc; local_120 = local_120 + 1) {
      local_124 = Imf_2_5::TiledRgbaInputFile::levelWidth
                            ((TiledRgbaInputFile *)CONCAT44(in_stack_fffffffffffffca4,uVar17),
                             in_stack_fffffffffffffc9c);
      local_128 = Imf_2_5::TiledRgbaInputFile::levelHeight
                            ((TiledRgbaInputFile *)CONCAT44(in_stack_fffffffffffffca4,uVar17),
                             in_stack_fffffffffffffc9c);
      Imf_2_5::Array2D<Imf_2_5::Array2D<Imf_2_5::Rgba>_>::operator[](&local_118,(long)local_11c);
      Imf_2_5::Array2D<Imf_2_5::Rgba>::resizeErase
                ((Array2D<Imf_2_5::Rgba> *)
                 CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                 in_stack_fffffffffffffcf8,(long)in_stack_fffffffffffffcf0);
      pAVar13 = Imf_2_5::Array2D<Imf_2_5::Array2D<Imf_2_5::Rgba>_>::operator[]
                          (&local_118,(long)local_11c);
      Imf_2_5::Array2D<Imf_2_5::Rgba>::operator[](pAVar13 + local_120,(long)-local_f8);
      Imf_2_5::TiledRgbaInputFile::setFrameBuffer
                ((TiledRgbaInputFile *)CONCAT44(CVar5,in_stack_fffffffffffffe90),pRVar12,
                 CONCAT44(iVar19,iVar18),CONCAT44(iVar7,RVar6));
      Imf_2_5::TiledRgbaInputFile::numXTiles
                ((TiledRgbaInputFile *)CONCAT44(in_stack_fffffffffffffca4,uVar17),
                 in_stack_fffffffffffffc9c);
      Imf_2_5::TiledRgbaInputFile::numYTiles
                ((TiledRgbaInputFile *)CONCAT44(in_stack_fffffffffffffca4,uVar17),
                 in_stack_fffffffffffffc9c);
      Imf_2_5::TiledRgbaInputFile::readTiles
                ((TiledRgbaInputFile *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0)
                 ,(int)((ulong)in_stack_fffffffffffffcd8 >> 0x20),(int)in_stack_fffffffffffffcd8,
                 (int)((ulong)in_stack_fffffffffffffcd0 >> 0x20),(int)in_stack_fffffffffffffcd0,
                 (int)((ulong)in_stack_fffffffffffffcc8 >> 0x20),(int)in_stack_fffffffffffffcf0);
    }
  }
  poVar8 = std::operator<<((ostream *)&std::cout," comparing");
  pvVar9 = (void *)std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar9,std::flush<char,std::char_traits<char>>);
  Imf_2_5::TiledRgbaInputFile::displayWindow((TiledRgbaInputFile *)0x21a9d4);
  Imf_2_5::Header::displayWindow((Header *)0x21a9eb);
  bVar2 = Imath_2_5::Box<Imath_2_5::Vec2<int>_>::operator==
                    ((Box<Imath_2_5::Vec2<int>_> *)in_stack_fffffffffffffcb0,
                     (Box<Imath_2_5::Vec2<int>_> *)CONCAT44(in_stack_fffffffffffffcac,h));
  if (!bVar2) {
    __assert_fail("in.displayWindow() == header.displayWindow()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                  ,0x187,
                  "void (anonymous namespace)::writeReadRGBARIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                 );
  }
  Imf_2_5::TiledRgbaInputFile::dataWindow((TiledRgbaInputFile *)0x21aa4e);
  Imf_2_5::Header::dataWindow((Header *)0x21aa65);
  bVar2 = Imath_2_5::Box<Imath_2_5::Vec2<int>_>::operator==
                    ((Box<Imath_2_5::Vec2<int>_> *)in_stack_fffffffffffffcb0,
                     (Box<Imath_2_5::Vec2<int>_> *)CONCAT44(in_stack_fffffffffffffcac,h));
  if (!bVar2) {
    __assert_fail("in.dataWindow() == header.dataWindow()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                  ,0x188,
                  "void (anonymous namespace)::writeReadRGBARIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                 );
  }
  fVar15 = Imf_2_5::TiledRgbaInputFile::pixelAspectRatio((TiledRgbaInputFile *)0x21aac8);
  pfVar14 = Imf_2_5::Header::pixelAspectRatio((Header *)0x21aae0);
  if ((fVar15 != *pfVar14) || (NAN(fVar15) || NAN(*pfVar14))) {
    __assert_fail("in.pixelAspectRatio() == header.pixelAspectRatio()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                  ,0x189,
                  "void (anonymous namespace)::writeReadRGBARIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                 );
  }
  Imf_2_5::TiledRgbaInputFile::screenWindowCenter
            ((TiledRgbaInputFile *)CONCAT44(in_stack_fffffffffffffcac,h));
  v = Imf_2_5::Header::screenWindowCenter((Header *)0x21ab47);
  bVar2 = Imath_2_5::Vec2<float>::operator==(&local_130,v);
  if (!bVar2) {
    __assert_fail("in.screenWindowCenter() == header.screenWindowCenter()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                  ,0x18a,
                  "void (anonymous namespace)::writeReadRGBARIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                 );
  }
  fVar15 = Imf_2_5::TiledRgbaInputFile::screenWindowWidth((TiledRgbaInputFile *)0x21ab9a);
  pfVar14 = Imf_2_5::Header::screenWindowWidth((Header *)0x21abb2);
  if ((fVar15 != *pfVar14) || (NAN(fVar15) || NAN(*pfVar14))) {
    __assert_fail("in.screenWindowWidth() == header.screenWindowWidth()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                  ,0x18b,
                  "void (anonymous namespace)::writeReadRGBARIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                 );
  }
  LVar4 = Imf_2_5::TiledRgbaInputFile::lineOrder((TiledRgbaInputFile *)0x21ac02);
  pLVar10 = Imf_2_5::Header::lineOrder((Header *)0x21ac18);
  if (LVar4 != *pLVar10) {
    __assert_fail("in.lineOrder() == header.lineOrder()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                  ,0x18c,
                  "void (anonymous namespace)::writeReadRGBARIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                 );
  }
  CVar5 = Imf_2_5::TiledRgbaInputFile::compression((TiledRgbaInputFile *)0x21ac63);
  pCVar11 = Imf_2_5::Header::compression((Header *)0x21ac79);
  if (CVar5 != *pCVar11) {
    __assert_fail("in.compression() == header.compression()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                  ,0x18d,
                  "void (anonymous namespace)::writeReadRGBARIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                 );
  }
  RVar6 = Imf_2_5::TiledRgbaInputFile::channels
                    ((TiledRgbaInputFile *)CONCAT44(in_stack_fffffffffffffca4,uVar17));
  if (RVar6 != local_14) {
    __assert_fail("in.channels() == channels",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                  ,0x18e,
                  "void (anonymous namespace)::writeReadRGBARIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                 );
  }
  local_134 = 0;
  do {
    if (local_100 <= local_134) {
      Imf_2_5::Array2D<Imf_2_5::Array2D<Imf_2_5::Rgba>_>::~Array2D
                ((Array2D<Imf_2_5::Array2D<Imf_2_5::Rgba>_> *)
                 CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
      Imf_2_5::TiledRgbaInputFile::~TiledRgbaInputFile(in_stack_fffffffffffffcb0);
      remove(local_8);
      Imf_2_5::Array2D<Imf_2_5::Array2D<Imf_2_5::Rgba>_>::~Array2D
                ((Array2D<Imf_2_5::Array2D<Imf_2_5::Rgba>_> *)
                 CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
      Imf_2_5::Header::~Header((Header *)in_stack_fffffffffffffcb0);
      return;
    }
    for (local_138 = 0; local_138 < local_fc; local_138 = local_138 + 1) {
      for (local_13c = 0;
          iVar7 = Imf_2_5::TiledRgbaInputFile::levelHeight
                            ((TiledRgbaInputFile *)CONCAT44(in_stack_fffffffffffffca4,uVar17),
                             in_stack_fffffffffffffc9c), local_13c < iVar7;
          local_13c = local_13c + 1) {
        for (local_140 = 0;
            iVar7 = Imf_2_5::TiledRgbaInputFile::levelWidth
                              ((TiledRgbaInputFile *)CONCAT44(in_stack_fffffffffffffca4,uVar17),
                               in_stack_fffffffffffffc9c), local_140 < iVar7;
            local_140 = local_140 + 1) {
          if ((local_14 & WRITE_R) == 0) {
            pAVar13 = Imf_2_5::Array2D<Imf_2_5::Array2D<Imf_2_5::Rgba>_>::operator[]
                                (&local_118,(long)local_134);
            pRVar12 = Imf_2_5::Array2D<Imf_2_5::Rgba>::operator[]
                                (pAVar13 + local_138,(long)local_13c);
            fVar15 = half::operator_cast_to_float(&pRVar12[local_140].r);
            if ((fVar15 != 0.0) || (NAN(fVar15))) {
              __assert_fail("(levels2[ly][lx])[y][x].r == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                            ,0x19c,
                            "void (anonymous namespace)::writeReadRGBARIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                           );
            }
          }
          else {
            pAVar13 = Imf_2_5::Array2D<Imf_2_5::Array2D<Imf_2_5::Rgba>_>::operator[]
                                (&local_118,(long)local_134);
            pRVar12 = Imf_2_5::Array2D<Imf_2_5::Rgba>::operator[]
                                (pAVar13 + local_138,(long)local_13c);
            fVar15 = half::operator_cast_to_float(&pRVar12[local_140].r);
            pAVar13 = Imf_2_5::Array2D<Imf_2_5::Array2D<Imf_2_5::Rgba>_>::operator[]
                                (&local_88,(long)local_134);
            pRVar12 = Imf_2_5::Array2D<Imf_2_5::Rgba>::operator[]
                                (pAVar13 + local_138,(long)local_13c);
            fVar16 = half::operator_cast_to_float(&pRVar12[local_140].r);
            if ((fVar15 != fVar16) || (NAN(fVar15) || NAN(fVar16))) {
              __assert_fail("(levels2[ly][lx])[y][x].r == (levels[ly][lx])[y][x].r",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                            ,0x19a,
                            "void (anonymous namespace)::writeReadRGBARIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                           );
            }
          }
          if ((local_14 & WRITE_G) == 0) {
            pAVar13 = Imf_2_5::Array2D<Imf_2_5::Array2D<Imf_2_5::Rgba>_>::operator[]
                                (&local_118,(long)local_134);
            pRVar12 = Imf_2_5::Array2D<Imf_2_5::Rgba>::operator[]
                                (pAVar13 + local_138,(long)local_13c);
            fVar15 = half::operator_cast_to_float(&pRVar12[local_140].g);
            if ((fVar15 != 0.0) || (NAN(fVar15))) {
              __assert_fail("(levels2[ly][lx])[y][x].g == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                            ,0x1a2,
                            "void (anonymous namespace)::writeReadRGBARIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                           );
            }
          }
          else {
            pAVar13 = Imf_2_5::Array2D<Imf_2_5::Array2D<Imf_2_5::Rgba>_>::operator[]
                                (&local_118,(long)local_134);
            pRVar12 = Imf_2_5::Array2D<Imf_2_5::Rgba>::operator[]
                                (pAVar13 + local_138,(long)local_13c);
            fVar15 = half::operator_cast_to_float(&pRVar12[local_140].g);
            pAVar13 = Imf_2_5::Array2D<Imf_2_5::Array2D<Imf_2_5::Rgba>_>::operator[]
                                (&local_88,(long)local_134);
            pRVar12 = Imf_2_5::Array2D<Imf_2_5::Rgba>::operator[]
                                (pAVar13 + local_138,(long)local_13c);
            fVar16 = half::operator_cast_to_float(&pRVar12[local_140].g);
            if ((fVar15 != fVar16) || (NAN(fVar15) || NAN(fVar16))) {
              __assert_fail("(levels2[ly][lx])[y][x].g == (levels[ly][lx])[y][x].g",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                            ,0x1a0,
                            "void (anonymous namespace)::writeReadRGBARIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                           );
            }
          }
          if ((local_14 & WRITE_B) == 0) {
            pAVar13 = Imf_2_5::Array2D<Imf_2_5::Array2D<Imf_2_5::Rgba>_>::operator[]
                                (&local_118,(long)local_134);
            pRVar12 = Imf_2_5::Array2D<Imf_2_5::Rgba>::operator[]
                                (pAVar13 + local_138,(long)local_13c);
            fVar15 = half::operator_cast_to_float(&pRVar12[local_140].b);
            if ((fVar15 != 0.0) || (NAN(fVar15))) {
              __assert_fail("(levels2[ly][lx])[y][x].b == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                            ,0x1a8,
                            "void (anonymous namespace)::writeReadRGBARIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                           );
            }
          }
          else {
            pAVar13 = Imf_2_5::Array2D<Imf_2_5::Array2D<Imf_2_5::Rgba>_>::operator[]
                                (&local_118,(long)local_134);
            pRVar12 = Imf_2_5::Array2D<Imf_2_5::Rgba>::operator[]
                                (pAVar13 + local_138,(long)local_13c);
            fVar15 = half::operator_cast_to_float(&pRVar12[local_140].b);
            pAVar13 = Imf_2_5::Array2D<Imf_2_5::Array2D<Imf_2_5::Rgba>_>::operator[]
                                (&local_88,(long)local_134);
            pRVar12 = Imf_2_5::Array2D<Imf_2_5::Rgba>::operator[]
                                (pAVar13 + local_138,(long)local_13c);
            fVar16 = half::operator_cast_to_float(&pRVar12[local_140].b);
            if ((fVar15 != fVar16) || (NAN(fVar15) || NAN(fVar16))) {
              __assert_fail("(levels2[ly][lx])[y][x].b == (levels[ly][lx])[y][x].b",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                            ,0x1a6,
                            "void (anonymous namespace)::writeReadRGBARIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                           );
            }
          }
          if ((local_14 & WRITE_A) == 0) {
            pAVar13 = Imf_2_5::Array2D<Imf_2_5::Array2D<Imf_2_5::Rgba>_>::operator[]
                                (&local_118,(long)local_134);
            pRVar12 = Imf_2_5::Array2D<Imf_2_5::Rgba>::operator[]
                                (pAVar13 + local_138,(long)local_13c);
            fVar15 = half::operator_cast_to_float(&pRVar12[local_140].a);
            if ((fVar15 != 1.0) || (NAN(fVar15))) {
              __assert_fail("(levels2[ly][lx])[y][x].a == 1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                            ,0x1ae,
                            "void (anonymous namespace)::writeReadRGBARIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                           );
            }
          }
          else {
            pAVar13 = Imf_2_5::Array2D<Imf_2_5::Array2D<Imf_2_5::Rgba>_>::operator[]
                                (&local_118,(long)local_134);
            pRVar12 = Imf_2_5::Array2D<Imf_2_5::Rgba>::operator[]
                                (pAVar13 + local_138,(long)local_13c);
            in_stack_fffffffffffffcc4 = half::operator_cast_to_float(&pRVar12[local_140].a);
            pAVar13 = Imf_2_5::Array2D<Imf_2_5::Array2D<Imf_2_5::Rgba>_>::operator[]
                                (&local_88,(long)local_134);
            pRVar12 = Imf_2_5::Array2D<Imf_2_5::Rgba>::operator[]
                                (pAVar13 + local_138,(long)local_13c);
            fVar15 = half::operator_cast_to_float(&pRVar12[local_140].a);
            if ((in_stack_fffffffffffffcc4 != fVar15) ||
               (NAN(in_stack_fffffffffffffcc4) || NAN(fVar15))) {
              __assert_fail("(levels2[ly][lx])[y][x].a == (levels[ly][lx])[y][x].a",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                            ,0x1ac,
                            "void (anonymous namespace)::writeReadRGBARIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                           );
            }
          }
        }
      }
    }
    local_134 = local_134 + 1;
  } while( true );
}

Assistant:

void
writeReadRGBARIP (const char fileName[],
	          int width,
		  int height,
		  RgbaChannels channels,
		  Compression comp,
		  int xSize, int ySize)
{
    cout << "levelMode 2" <<
            ", compression " << comp <<
            ", tileSize " << xSize << "x" << ySize << endl;

    Header header (width, height);
    header.lineOrder() = INCREASING_Y;
    header.compression() = comp;
    
    Array2D < Array2D<Rgba> > levels;

    {
        cout << " writing" << flush;

        remove (fileName);
        TiledRgbaOutputFile out (fileName, header, channels,
                                 xSize, ySize, RIPMAP_LEVELS, ROUND_UP);

	levels.resizeErase (out.numYLevels(), out.numXLevels());

        for (int ylevel = 0; ylevel < out.numYLevels(); ++ylevel)
        {            
            for (int xlevel = 0; xlevel < out.numXLevels(); ++xlevel)
            {
                int levelWidth = out.levelWidth(xlevel);
                int levelHeight = out.levelHeight(ylevel);
                levels[ylevel][xlevel].resizeErase(levelHeight, levelWidth);
                fillPixels (levels[ylevel][xlevel], levelWidth, levelHeight);

                out.setFrameBuffer (&(levels[ylevel][xlevel])[0][0], 1,
                                    levelWidth); 
                out.writeTiles (0, out.numXTiles(xlevel) - 1,
                                0, out.numYTiles(ylevel) - 1, xlevel, ylevel);
            }
        }
    }

    {
        cout << " reading" << flush;

        TiledRgbaInputFile in (fileName);
        const Box2i &dw = in.dataWindow();
        int dwx = dw.min.x;
        int dwy = dw.min.y;        
        
        int numXLevels = in.numXLevels();
        int numYLevels = in.numYLevels();
	Array2D < Array2D<Rgba> > levels2 (numYLevels, numXLevels);
        
        for (int ylevel = 0; ylevel < numYLevels; ++ylevel)
        {
            for (int xlevel = 0; xlevel < numXLevels; ++xlevel)
            {
                int levelWidth  = in.levelWidth(xlevel);
                int levelHeight = in.levelHeight(ylevel);
                levels2[ylevel][xlevel].resizeErase(levelHeight, levelWidth);
                in.setFrameBuffer (&(levels2[ylevel][xlevel])[-dwy][-dwx], 1,
                                   levelWidth);
                                   
                in.readTiles (0, in.numXTiles(xlevel) - 1,
                              0, in.numYTiles(ylevel) - 1, xlevel, ylevel);
            }
        }

        cout << " comparing" << endl << flush;

        assert (in.displayWindow() == header.displayWindow());
        assert (in.dataWindow() == header.dataWindow());
        assert (in.pixelAspectRatio() == header.pixelAspectRatio());
        assert (in.screenWindowCenter() == header.screenWindowCenter());
        assert (in.screenWindowWidth() == header.screenWindowWidth());
        assert (in.lineOrder() == header.lineOrder());
        assert (in.compression() == header.compression());
        assert (in.channels() == channels);

        for (int ly = 0; ly < numYLevels; ++ly)
        {
            for (int lx = 0; lx < numXLevels; ++lx)
            {
                for (int y = 0; y < in.levelHeight(ly); ++y)
                {
                    for (int x = 0; x < in.levelWidth(lx); ++x)
                    {
                        if (channels & WRITE_R)
                            assert ((levels2[ly][lx])[y][x].r ==
                                    (levels[ly][lx])[y][x].r);
                        else
                            assert ((levels2[ly][lx])[y][x].r == 0);

                        if (channels & WRITE_G)
                            assert ((levels2[ly][lx])[y][x].g ==
                                    (levels[ly][lx])[y][x].g);
                        else
                            assert ((levels2[ly][lx])[y][x].g == 0);

                        if (channels & WRITE_B)
                            assert ((levels2[ly][lx])[y][x].b ==
                                    (levels[ly][lx])[y][x].b);
                        else
                            assert ((levels2[ly][lx])[y][x].b == 0);

                        if (channels & WRITE_A)
                            assert ((levels2[ly][lx])[y][x].a ==
                                    (levels[ly][lx])[y][x].a);
                        else
                            assert ((levels2[ly][lx])[y][x].a == 1);
                    }
                }
            }
        }
    }

    remove (fileName);
}